

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

int ON_Font::WindowsLogfontWeightFromWeight(Weight font_weight)

{
  int iVar1;
  uint uVar2;
  undefined4 local_10;
  int delta;
  int logfont_weight;
  Weight font_weight_local;
  
  local_10 = (uint)font_weight * 100;
  if (local_10 < 0x32) {
    local_10 = 400;
  }
  if (local_10 < 0x96) {
    local_10 = 100;
  }
  else if (local_10 < 0x352) {
    if (local_10 % 100 != 0) {
      uVar2 = local_10 % 100;
      if (uVar2 < 0x32) {
        iVar1 = -uVar2;
      }
      else {
        iVar1 = 100 - uVar2;
      }
      local_10 = local_10 + iVar1;
    }
  }
  else {
    local_10 = 900;
  }
  return local_10;
}

Assistant:

int ON_Font::WindowsLogfontWeightFromWeight(
  ON_Font::Weight font_weight
  )
{
  int logfont_weight = (int)(100U*static_cast<unsigned int>(font_weight));
  if ( logfont_weight < 50 )
    logfont_weight = 400;
  if ( logfont_weight < 150 )
    logfont_weight = 100;
  else if ( logfont_weight >= 850 )
    logfont_weight = 900;
  else if (0 != logfont_weight % 100)
  {
    int delta = logfont_weight %100;
    if (delta < 50)
      logfont_weight -= delta;
    else
      logfont_weight += (100-delta);
  }
  return logfont_weight;
}